

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<const_QtPrivate::QMetaTypeInterface_*>::reallocate
          (QPodArrayOps<const_QtPrivate::QMetaTypeInterface_*> *this,qsizetype alloc,
          AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  QMetaTypeInterface **in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<const_QtPrivate::QMetaTypeInterface_*>_*,_const_QtPrivate::QMetaTypeInterface_**>
  pVar2;
  pair<QTypedArrayData<const_QtPrivate::QMetaTypeInterface_*>_*,_const_QtPrivate::QMetaTypeInterface_**>
  pair;
  QMetaTypeInterface *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<const_QtPrivate::QMetaTypeInterface_*>::reallocateUnaligned
                    ((QTypedArrayData<const_QtPrivate::QMetaTypeInterface_*> *)&DAT_aaaaaaaaaaaaaaaa
                     ,in_RDI,in_RSI,in_EDX);
  local_10 = (QMetaTypeInterface *)pVar2.second;
  if (local_10 == (QMetaTypeInterface *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      qBadAlloc();
    }
  }
  else {
    *in_RDI = (QMetaTypeInterface *)pVar2.first;
    in_RDI[1] = local_10;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }